

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::SharedCtor(BorderAmounts_EdgeSizes *this)

{
  this->startedgesize_ = 0;
  this->endedgesize_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void BorderAmounts_EdgeSizes::SharedCtor() {
  ::memset(&startedgesize_, 0, reinterpret_cast<char*>(&endedgesize_) -
    reinterpret_cast<char*>(&startedgesize_) + sizeof(endedgesize_));
  _cached_size_ = 0;
}